

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsValidBaseImage(Instruction *this)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *pIVar1;
  bool bVar2;
  
  id = type_id(this);
  if (id == 0) {
    bVar2 = false;
  }
  else {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    pIVar1 = analysis::DefUseManager::GetDef(this_00,id);
    bVar2 = (pIVar1->opcode_ & ~OpSourceContinued) == OpTypeImage;
  }
  return bVar2;
}

Assistant:

bool Instruction::IsValidBaseImage() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  return (type->opcode() == spv::Op::OpTypeImage ||
          type->opcode() == spv::Op::OpTypeSampledImage);
}